

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawGrid(int color)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double miny;
  double minx;
  double exty;
  double extx;
  double minlen;
  mline_t ml;
  double end;
  double start;
  double y;
  double x;
  int color_local;
  
  dVar4 = sqrt(m_w * m_w + m_h * m_h);
  dVar2 = m_y;
  dVar1 = m_x;
  dVar5 = (dVar4 - m_w) / 2.0;
  dVar6 = (dVar4 - m_h) / 2.0;
  dVar7 = ceil(((m_x - dVar5) - bmaporgx) / 128.0);
  ml.b.y = (dVar1 + dVar4) - dVar5;
  for (y = dVar7 * 128.0 + bmaporgx; y < ml.b.y; y = y + 128.0) {
    minlen = y;
    ml.a.y = y;
    ml.a.x = dVar2 - dVar6;
    ml.b.x = ml.a.x + dVar4;
    iVar3 = FIntCVar::operator_cast_to_int(&am_rotate);
    if (iVar3 == 1) {
LAB_0042bcdd:
      AM_rotatePoint(&minlen,(double *)&ml);
      AM_rotatePoint(&ml.a.y,&ml.b.x);
    }
    else {
      iVar3 = FIntCVar::operator_cast_to_int(&am_rotate);
      if ((iVar3 == 2) && ((viewactive & 1U) != 0)) goto LAB_0042bcdd;
    }
    AM_drawMline((mline_t *)&minlen,color);
  }
  dVar7 = ceil(((dVar2 - dVar6) - bmaporgy) / 128.0);
  start = dVar7 * 128.0 + bmaporgy;
  ml.b.y = (dVar2 + dVar4) - dVar6;
  do {
    if (ml.b.y <= start) {
      return;
    }
    minlen = dVar1 - dVar5;
    ml.a.y = minlen + dVar4;
    ml.a.x = start;
    ml.b.x = start;
    iVar3 = FIntCVar::operator_cast_to_int(&am_rotate);
    if (iVar3 == 1) {
LAB_0042be08:
      AM_rotatePoint(&minlen,(double *)&ml);
      AM_rotatePoint(&ml.a.y,&ml.b.x);
    }
    else {
      iVar3 = FIntCVar::operator_cast_to_int(&am_rotate);
      if ((iVar3 == 2) && ((viewactive & 1U) != 0)) goto LAB_0042be08;
    }
    AM_drawMline((mline_t *)&minlen,color);
    start = start + 128.0;
  } while( true );
}

Assistant:

void AM_drawGrid (int color)
{
	double x, y;
	double start, end;
	mline_t ml;
	double minlen, extx, exty;
	double minx, miny;

	// [RH] Calculate a minimum for how long the grid lines should be so that
	// they cover the screen at any rotation.
	minlen = sqrt (m_w*m_w + m_h*m_h);
	extx = (minlen - m_w) / 2;
	exty = (minlen - m_h) / 2;

	minx = m_x;
	miny = m_y;

	// Figure out start of vertical gridlines
	start = minx - extx;
	start = ceil((start - bmaporgx) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgx;

	end = minx + minlen - extx;

	// draw vertical gridlines
	for (x = start; x < end; x += MAPBLOCKUNITS)
	{
		ml.a.x = x;
		ml.b.x = x;
		ml.a.y = miny - exty;
		ml.b.y = ml.a.y + minlen;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline(&ml, color);
	}

	// Figure out start of horizontal gridlines
	start = miny - exty;
	start = ceil((start - bmaporgy) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgy;
	end = miny + minlen - exty;

	// draw horizontal gridlines
	for (y=start; y<end; y+=MAPBLOCKUNITS)
	{
		ml.a.x = minx - extx;
		ml.b.x = ml.a.x + minlen;
		ml.a.y = y;
		ml.b.y = y;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline (&ml, color);
	}
}